

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

bool __thiscall cmCTest::AddTestsForDashboardType(cmCTest *this,string *targ)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)targ);
  if (iVar1 == 0) {
    this->InteractiveDebugMode = false;
    this->TestModel = 0;
    pcVar2 = "ExperimentalStart";
LAB_0025ddaf:
    SetTest(this,pcVar2 + 0xc,true);
    SetTest(this,"Configure",true);
    SetTest(this,"Build",true);
    pcVar2 = "Test";
LAB_0025ddeb:
    SetTest(this,pcVar2,true);
    SetTest(this,"Coverage",true);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)targ);
    if (iVar1 == 0) {
      this->InteractiveDebugMode = false;
      this->TestModel = 0;
LAB_0025de29:
      pcVar2 = "Start";
      goto LAB_0025deb5;
    }
    iVar1 = std::__cxx11::string::compare((char *)targ);
    if (iVar1 == 0) {
      this->InteractiveDebugMode = false;
      this->TestModel = 0;
LAB_0025de46:
      pcVar2 = "Update";
      goto LAB_0025deb5;
    }
    iVar1 = std::__cxx11::string::compare((char *)targ);
    if (iVar1 == 0) {
      this->InteractiveDebugMode = false;
      this->TestModel = 0;
LAB_0025de60:
      pcVar2 = "Configure";
      goto LAB_0025deb5;
    }
    iVar1 = std::__cxx11::string::compare((char *)targ);
    if (iVar1 == 0) {
      this->InteractiveDebugMode = false;
      this->TestModel = 0;
LAB_0025de7a:
      pcVar2 = "Build";
      goto LAB_0025deb5;
    }
    iVar1 = std::__cxx11::string::compare((char *)targ);
    if (iVar1 == 0) {
      this->InteractiveDebugMode = false;
      this->TestModel = 0;
LAB_0025deae:
      pcVar2 = "Test";
      goto LAB_0025deb5;
    }
    iVar1 = std::__cxx11::string::compare((char *)targ);
    if ((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)targ), iVar1 == 0)) {
      this->InteractiveDebugMode = false;
      this->TestModel = 0;
LAB_0025de94:
      pcVar2 = "MemCheck";
      goto LAB_0025deb5;
    }
    iVar1 = std::__cxx11::string::compare((char *)targ);
    if (iVar1 == 0) {
      this->InteractiveDebugMode = false;
      this->TestModel = 0;
LAB_0025dedd:
      pcVar2 = "Coverage";
      goto LAB_0025deb5;
    }
    iVar1 = std::__cxx11::string::compare((char *)targ);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 2;
LAB_0025df0d:
        SetTest(this,"Start",true);
        pcVar2 = "ExperimentalUpdate";
        goto LAB_0025ddaf;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 2;
        goto LAB_0025de29;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 2;
        goto LAB_0025de46;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 2;
        goto LAB_0025de60;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 2;
        goto LAB_0025de7a;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 2;
        goto LAB_0025deae;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if ((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)targ), iVar1 == 0)) {
        this->InteractiveDebugMode = false;
        this->TestModel = 2;
        goto LAB_0025de94;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 2;
        goto LAB_0025dedd;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 2;
        goto LAB_0025de0c;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
        goto LAB_0025df0d;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
        goto LAB_0025de29;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
        goto LAB_0025de46;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
        goto LAB_0025de60;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
        goto LAB_0025de7a;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
        goto LAB_0025deae;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if ((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)targ), iVar1 == 0)) {
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
        goto LAB_0025de94;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
        goto LAB_0025dedd;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
        goto LAB_0025de0c;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 0;
        pcVar2 = "ExperimentalStart";
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)targ);
        if (iVar1 != 0) {
          return false;
        }
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
        SetTest(this,"Start",true);
        pcVar2 = "ExperimentalUpdate";
      }
      SetTest(this,pcVar2 + 0xc,true);
      SetTest(this,"Configure",true);
      SetTest(this,"Build",true);
      pcVar2 = "MemCheck";
      goto LAB_0025ddeb;
    }
    this->InteractiveDebugMode = false;
    this->TestModel = 0;
  }
LAB_0025de0c:
  pcVar2 = "Submit";
LAB_0025deb5:
  SetTest(this,pcVar2,true);
  return true;
}

Assistant:

bool cmCTest::AddTestsForDashboardType(std::string &targ)
{
  if ( targ == "Experimental" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Start");
    this->SetTest("Configure");
    this->SetTest("Build");
    this->SetTest("Test");
    this->SetTest("Coverage");
    this->SetTest("Submit");
    }
  else if ( targ == "ExperimentalStart" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Start");
    }
  else if ( targ == "ExperimentalUpdate" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Update");
    }
  else if ( targ == "ExperimentalConfigure" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Configure");
    }
  else if ( targ == "ExperimentalBuild" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Build");
    }
  else if ( targ == "ExperimentalTest" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Test");
    }
  else if ( targ == "ExperimentalMemCheck"
            || targ == "ExperimentalPurify" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("MemCheck");
    }
  else if ( targ == "ExperimentalCoverage" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Coverage");
    }
  else if ( targ == "ExperimentalSubmit" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Submit");
    }
  else if ( targ == "Continuous" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Start");
    this->SetTest("Update");
    this->SetTest("Configure");
    this->SetTest("Build");
    this->SetTest("Test");
    this->SetTest("Coverage");
    this->SetTest("Submit");
    }
  else if ( targ == "ContinuousStart" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Start");
    }
  else if ( targ == "ContinuousUpdate" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Update");
    }
  else if ( targ == "ContinuousConfigure" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Configure");
    }
  else if ( targ == "ContinuousBuild" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Build");
    }
  else if ( targ == "ContinuousTest" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Test");
    }
  else if ( targ == "ContinuousMemCheck"
        || targ == "ContinuousPurify" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("MemCheck");
    }
  else if ( targ == "ContinuousCoverage" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Coverage");
    }
  else if ( targ == "ContinuousSubmit" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Submit");
    }
  else if ( targ == "Nightly" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Start");
    this->SetTest("Update");
    this->SetTest("Configure");
    this->SetTest("Build");
    this->SetTest("Test");
    this->SetTest("Coverage");
    this->SetTest("Submit");
    }
  else if ( targ == "NightlyStart" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Start");
    }
  else if ( targ == "NightlyUpdate" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Update");
    }
  else if ( targ == "NightlyConfigure" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Configure");
    }
  else if ( targ == "NightlyBuild" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Build");
    }
  else if ( targ == "NightlyTest" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Test");
    }
  else if ( targ == "NightlyMemCheck"
            || targ == "NightlyPurify" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("MemCheck");
    }
  else if ( targ == "NightlyCoverage" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Coverage");
    }
  else if ( targ == "NightlySubmit" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Submit");
    }
  else if ( targ == "MemoryCheck" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Start");
    this->SetTest("Configure");
    this->SetTest("Build");
    this->SetTest("MemCheck");
    this->SetTest("Coverage");
    this->SetTest("Submit");
    }
  else if ( targ == "NightlyMemoryCheck" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Start");
    this->SetTest("Update");
    this->SetTest("Configure");
    this->SetTest("Build");
    this->SetTest("MemCheck");
    this->SetTest("Coverage");
    this->SetTest("Submit");
    }
  else
    {
    return false;
    }
  return true;
}